

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearboxAngled.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsGearboxAngled::ChShaftsGearboxAngled
          (ChShaftsGearboxAngled *this,ChShaftsGearboxAngled *other)

{
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsGearboxAngled_0116e5b8;
  ChConstraintThreeGeneric::ChConstraintThreeGeneric(&this->constraint);
  (this->shaft_dir1).m_data[2] = 0.0;
  (this->shaft_dir2).m_data[0] = 0.0;
  (this->shaft_dir2).m_data[1] = 0.0;
  (this->shaft_dir2).m_data[2] = 0.0;
  (this->shaft_dir1).m_data[0] = 0.0;
  (this->shaft_dir1).m_data[1] = 0.0;
  (this->shaft_dir1).m_data[2] = 0.0;
  (this->shaft_dir2).m_data[0] = 0.0;
  this->t0 = other->t0;
  if (other != this) {
    (this->shaft_dir1).m_data[0] = (other->shaft_dir1).m_data[0];
    (this->shaft_dir1).m_data[1] = (other->shaft_dir1).m_data[1];
    (this->shaft_dir1).m_data[2] = (other->shaft_dir1).m_data[2];
    (this->shaft_dir2).m_data[0] = (other->shaft_dir2).m_data[0];
    (this->shaft_dir2).m_data[1] = (other->shaft_dir2).m_data[1];
    (this->shaft_dir2).m_data[2] = (other->shaft_dir2).m_data[2];
  }
  this->torque_react = other->torque_react;
  this->body = (ChBodyFrame *)0x0;
  this->shaft1 = (ChShaft *)SUB168(ZEXT816(0) << 0x20,0);
  this->shaft2 = (ChShaft *)SUB168(ZEXT816(0) << 0x20,8);
  return;
}

Assistant:

ChShaftsGearboxAngled::ChShaftsGearboxAngled(const ChShaftsGearboxAngled& other) : ChPhysicsItem(other) {
    t0 = other.t0;
    shaft_dir1 = other.shaft_dir1;
    shaft_dir2 = other.shaft_dir2;

    torque_react = other.torque_react;
    shaft1 = NULL;
    shaft2 = NULL;
    body = NULL;
}